

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O2

wchar_t borg_slot(wchar_t tval,wchar_t sval)

{
  ulong uVar1;
  _Bool *p_Var2;
  ulong uVar3;
  
  p_Var2 = &borg_items->aware;
  uVar1 = 0xffffffffffffffff;
  for (uVar3 = 0; z_info->pack_size != uVar3; uVar3 = uVar3 + 1) {
    if ((((p_Var2[6] != false) && (*p_Var2 == true)) && ((uint)p_Var2[2] == tval)) &&
       (((uint)p_Var2[3] == sval &&
        (((wchar_t)uVar1 < L'\0' || (p_Var2[6] <= borg_items[uVar1 & 0xffffffff].iqty)))))) {
      uVar1 = uVar3 & 0xffffffff;
    }
    p_Var2 = p_Var2 + 0x388;
  }
  return (wchar_t)uVar1;
}

Assistant:

int borg_slot(int tval, int sval)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip un-aware items */
        if (!item->aware)
            continue;

        /* Require correct tval */
        if (item->tval != tval)
            continue;

        /* Require correct sval */
        if (item->sval != sval)
            continue;

        /* Prefer smallest pile */
        if ((n >= 0) && (item->iqty > borg_items[n].iqty))
            continue;

        /* Prefer largest "pval" (even if smaller pile)*/
        if ((n >= 0) && (item->pval < borg_items[n].pval)
            && (item->iqty > borg_items[n].iqty))
            continue;

        /* Save this item */
        n = i;
    }

    /* Done */
    return n;
}